

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

QVariant * __thiscall
Mustache::QtVariantContext::value
          (QVariant *__return_storage_ptr__,QtVariantContext *this,QString *key)

{
  bool bVar1;
  byte bVar2;
  QVariant *pQVar3;
  qsizetype qVar4;
  const_reference value_00;
  QList<QString> local_88;
  byte local_69;
  int local_68;
  int i;
  QFlags<Qt::SplitBehaviorFlags> local_54;
  QString local_50;
  undefined1 local_38 [8];
  QStringList keyPath;
  QString *key_local;
  QtVariantContext *this_local;
  QVariant *value;
  
  keyPath.d.size = (qsizetype)key;
  bVar1 = QString::operator==(key,".");
  if ((!bVar1) ||
     (bVar1 = QList<QVariant>::isEmpty(&(this->m_contextStack).super_QList<QVariant>), bVar1)) {
    qVar4 = keyPath.d.size;
    QString::QString(&local_50,".");
    QFlags<Qt::SplitBehaviorFlags>::QFlags(&local_54,KeepEmptyParts);
    QString::split((QString *)local_38,(QFlags_conflict *)qVar4,(CaseSensitivity)&local_50);
    QString::~QString(&local_50);
    qVar4 = QList<QVariant>::count(&(this->m_contextStack).super_QList<QVariant>);
    local_68 = (int)qVar4;
    do {
      local_68 = local_68 + -1;
      if (local_68 < 0) {
        ::QVariant::QVariant(__return_storage_ptr__);
        break;
      }
      local_69 = 0;
      value_00 = QList<QVariant>::at(&(this->m_contextStack).super_QList<QVariant>,(long)local_68);
      QList<QString>::QList(&local_88,(QList<QString> *)local_38);
      variantMapValueForKeyPath(__return_storage_ptr__,value_00,&local_88);
      QList<QString>::~QList(&local_88);
      bVar2 = ::QVariant::isNull();
      bVar1 = (bVar2 & 1) == 0;
      if (bVar1) {
        local_69 = 1;
      }
      if ((local_69 & 1) == 0) {
        ::QVariant::~QVariant(__return_storage_ptr__);
      }
    } while (!bVar1);
    QList<QString>::~QList((QList<QString> *)local_38);
  }
  else {
    pQVar3 = QList<QVariant>::last(&(this->m_contextStack).super_QList<QVariant>);
    ::QVariant::QVariant(__return_storage_ptr__,pQVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QtVariantContext::value(const QString& key) const
{
	if (key == "." && !m_contextStack.isEmpty()) {
		return m_contextStack.last();
	}
	QStringList keyPath = key.split(".");
	for (int i = m_contextStack.count()-1; i >= 0; i--) {
		QVariant value = variantMapValueForKeyPath(m_contextStack.at(i), keyPath);
		if (!value.isNull()) {
			return value;
		}
	}
	return QVariant();
}